

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_export.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ExportAggregateFunctionBindData::Copy(ExportAggregateFunctionBindData *this)

{
  pointer pBVar1;
  unique_ptr<duckdb::ExportAggregateFunctionBindData,_std::default_delete<duckdb::ExportAggregateFunctionBindData>_>
  *in_RDI;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> this_00;
  unique_ptr<duckdb::ExportAggregateFunctionBindData,_std::default_delete<duckdb::ExportAggregateFunctionBindData>_>
  *args;
  
  this_00._M_head_impl = (FunctionData *)in_RDI;
  args = in_RDI;
  pBVar1 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                         *)in_RDI);
  (*(pBVar1->super_Expression).super_BaseExpression._vptr_BaseExpression[0x11])();
  make_uniq<duckdb::ExportAggregateFunctionBindData,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)args);
  unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
  unique_ptr<duckdb::ExportAggregateFunctionBindData,std::default_delete<std::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>>>,void>
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             this_00._M_head_impl,in_RDI);
  unique_ptr<duckdb::ExportAggregateFunctionBindData,_std::default_delete<duckdb::ExportAggregateFunctionBindData>,_true>
  ::~unique_ptr((unique_ptr<duckdb::ExportAggregateFunctionBindData,_std::default_delete<duckdb::ExportAggregateFunctionBindData>,_true>
                 *)0x13db09a);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             0x13db0a4);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
         this_00._M_head_impl;
}

Assistant:

unique_ptr<FunctionData> ExportAggregateFunctionBindData::Copy() const {
	return make_uniq<ExportAggregateFunctionBindData>(aggregate->Copy());
}